

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

void Abc_WriteBoothPartialProducts(FILE *pFile,int nVars)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *pGia;
  Mini_Aig_t *p;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  char *__format;
  ulong uVar10;
  ulong uVar11;
  int local_4c;
  
  uVar9 = (ulong)(uint)nVars;
  pGia = Abc_GenSignedBooth(nVars,nVars);
  p = Gia_ManToMiniAig(pGia);
  Gia_ManStop(pGia);
  iVar3 = p->nSize;
  if (1 < (uint)nVars) {
    uVar9 = 0;
    uVar8 = nVars - 1;
    do {
      uVar9 = (ulong)((int)uVar9 + 1);
      bVar1 = 9 < uVar8;
      uVar8 = uVar8 / 10;
    } while (bVar1);
  }
  uVar8 = iVar3 / 2;
  iVar2 = nVars * 2;
  if (nVars == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar6 = iVar2 - 1;
    do {
      uVar11 = (ulong)((int)uVar11 + 1);
      bVar1 = 9 < uVar6;
      uVar6 = uVar6 / 10;
    } while (bVar1);
  }
  uVar10 = (ulong)uVar8;
  if (1 < uVar8) {
    uVar7 = (ulong)(uVar8 - 1);
    uVar10 = 0;
    do {
      uVar6 = (uint)uVar7;
      uVar7 = uVar7 / 10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (9 < uVar6);
  }
  fprintf((FILE *)pFile,".names pp%0*d\n",uVar10,0);
  if (3 < iVar3) {
    uVar6 = 2;
    if (2 < (int)uVar8) {
      uVar6 = uVar8;
    }
    local_4c = 0;
    uVar7 = 0;
    do {
      uVar8 = (int)uVar7 + 1;
      iVar3 = Mini_AigNodeFanin0(p,uVar8);
      if (iVar3 == 0x7fffffff) {
        if (nVars < (int)uVar8) {
          if (iVar2 < (int)uVar8) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                          ,0x430,"void Abc_WriteBoothPartialProducts(FILE *, int)");
          }
          uVar7 = (ulong)(uint)((int)uVar7 - nVars);
          __format = ".names b%0*d pp%0*d\n1 1\n";
        }
        else {
          __format = ".names a%0*d pp%0*d\n1 1\n";
        }
        fprintf((FILE *)pFile,__format,uVar9,uVar7,uVar10,(ulong)uVar8);
      }
      else {
        iVar3 = Mini_AigNodeFanin0(p,uVar8);
        if ((iVar3 == 0x7fffffff) || (iVar3 = Mini_AigNodeFanin1(p,uVar8), iVar3 != 0x7fffffff)) {
          iVar3 = Mini_AigNodeFanin0(p,uVar8);
          if ((iVar3 == 0x7fffffff) || (iVar3 = Mini_AigNodeFanin1(p,uVar8), iVar3 == 0x7fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                          ,0x43f,"void Abc_WriteBoothPartialProducts(FILE *, int)");
          }
          uVar4 = Mini_AigNodeFanin0(p,uVar8);
          uVar5 = Mini_AigNodeFanin1(p,uVar8);
          if (((int)uVar4 < 0) || ((int)uVar5 < 0)) {
LAB_002d24e2:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          fprintf((FILE *)pFile,".names pp%0*d pp%0*d pp%0*d\n%d%d 1\n",uVar10,(ulong)(uVar4 >> 1),
                  uVar10,(ulong)(uVar5 >> 1),uVar10,(ulong)uVar8,(ulong)(~uVar4 & 1),
                  (ulong)(~uVar5 & 1));
        }
        else {
          uVar4 = Mini_AigNodeFanin0(p,uVar8);
          if ((int)uVar4 < 0) goto LAB_002d24e2;
          fprintf((FILE *)pFile,".names pp%0*d y%0*d_%0*d\n%d 1\n",uVar10,(ulong)(uVar4 >> 1),uVar9,
                  (long)local_4c / (long)iVar2 & 0xffffffff,uVar11,
                  (long)local_4c % (long)iVar2 & 0xffffffff,(ulong)(~uVar4 & 1));
          local_4c = local_4c + 1;
        }
      }
      uVar7 = (ulong)uVar8;
    } while (uVar6 - 1 != uVar8);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  return;
}

Assistant:

void Abc_WriteBoothPartialProducts( FILE * pFile, int nVars )
{
    Mini_Aig_t * p = Abc_GenSignedBoothMini( nVars, nVars );
    int i, nNodes = Mini_AigNodeNum(p);
    int nDigits   = Abc_Base10Log( nVars );
    int nDigits2  = Abc_Base10Log( 2*nVars );
    int nDigits3  = Abc_Base10Log( nNodes );
    int nOut = 0;
    fprintf( pFile, ".names pp%0*d\n", nDigits3, 0 );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
        {
            if ( i > 0 && i <= nVars )
                fprintf( pFile, ".names a%0*d pp%0*d\n1 1\n", nDigits, i-1,       nDigits3, i );
            else if ( i > nVars && i <= 2*nVars )
                fprintf( pFile, ".names b%0*d pp%0*d\n1 1\n", nDigits, i-1-nVars, nDigits3, i );
            else assert( 0 );
        }
        else if ( Mini_AigNodeIsPo( p, i ) )
        {
            int Lit = Mini_AigNodeFanin0( p, i );
            fprintf( pFile, ".names pp%0*d y%0*d_%0*d\n%d 1\n", nDigits3, Abc_Lit2Var(Lit), nDigits, nOut/(2*nVars), nDigits2, nOut%(2*nVars), !Abc_LitIsCompl(Lit) );
            nOut++;
        }
        else if ( Mini_AigNodeIsAnd( p, i ) )
        {
            int Lit0 = Mini_AigNodeFanin0( p, i );
            int Lit1 = Mini_AigNodeFanin1( p, i );
            fprintf( pFile, ".names pp%0*d pp%0*d pp%0*d\n%d%d 1\n", 
                nDigits3, Abc_Lit2Var(Lit0), nDigits3, Abc_Lit2Var(Lit1), nDigits3, i, !Abc_LitIsCompl(Lit0), !Abc_LitIsCompl(Lit1) );
        }
        else assert( 0 );
    }
    Mini_AigStop( p );
}